

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::APITest2::iterate(APITest2 *this)

{
  bool bVar1;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  allocator<char> local_31;
  string local_30;
  APITest2 *local_10;
  APITest2 *this_local;
  
  local_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_ARB_shader_subroutine is not supported.",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_30);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  verifyGLGetActiveSubroutineNameFunctionality(this);
  verifyGLGetActiveSubroutineUniformNameFunctionality(this);
  if ((this->m_has_test_passed & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult APITest2::iterate()
{
	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Initialize a test program object */
	initTest();

	/* Verify glGetActiveSubroutineName() works correctly */
	verifyGLGetActiveSubroutineNameFunctionality();

	/* Verify glGetActiveSubroutineUniformName() works correctly */
	verifyGLGetActiveSubroutineUniformNameFunctionality();

	/* Done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}